

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber allocLib(void)

{
  TA_RetCode TVar1;
  TA_RetCode retCode;
  ErrorNumber local_4;
  
  TVar1 = TA_Initialize();
  if (TVar1 == TA_SUCCESS) {
    local_4 = TA_TEST_PASS;
  }
  else {
    printf("TA_Initialize failed [%d]\n",(ulong)TVar1);
    local_4 = TA_TESTUTIL_INIT_FAILED;
  }
  return local_4;
}

Assistant:

ErrorNumber allocLib()
{
   TA_RetCode retCode;

   /* Initialize the library. */
   retCode = TA_Initialize();
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_Initialize failed [%d]\n", retCode );
      return TA_TESTUTIL_INIT_FAILED;
   }

   return TA_TEST_PASS;
}